

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QtWidgetsExtraCache.cpp
# Opt level: O0

QPixmap * QtWidgetsExtraCache::cachedPixmapColor(QColor *color,QSize *size)

{
  byte bVar1;
  int a;
  int fieldWidth;
  QSize *in_RDX;
  QPixmap *in_RDI;
  QString key;
  QPixmap *pixmap;
  char16_t *str;
  DataPointer *in_stack_fffffffffffffed8;
  QPixmap *this;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  QPixmap *other;
  QArrayDataPointer<char16_t> *this_00;
  QPixmap local_f8 [28];
  undefined1 local_dc;
  QLatin1Char local_db [4];
  QLatin1Char local_d7 [4];
  QLatin1Char local_d3 [3];
  QPixmap *in_stack_ffffffffffffff30;
  QString *in_stack_ffffffffffffff38;
  QArrayDataPointer<char16_t> local_a8;
  undefined1 local_90 [24];
  QString local_78 [3];
  QSize *local_30;
  char16_t *local_18;
  char16_t *local_10;
  QArrayDataPointer<char16_t> *local_8;
  
  this_00 = &local_a8;
  local_10 = L"%1-%2x%3-pixmap";
  local_18 = L"%1-%2x%3-pixmap";
  other = in_RDI;
  local_30 = in_RDX;
  local_8 = this_00;
  QArrayDataPointer<char16_t>::QArrayDataPointer(this_00,(Data *)0x0,L"%1-%2x%3-pixmap",0xf);
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffed8);
  QColor::name((NameFormat)&stack0xffffffffffffff30);
  QLatin1Char::QLatin1Char(local_d3,' ');
  QChar::QChar((QChar *)in_stack_fffffffffffffed8,
               (QLatin1Char)(char)((uint)in_stack_fffffffffffffee4 >> 0x18));
  QString::arg(local_78,(int)local_90,(QChar *)&stack0xffffffffffffff30);
  a = QSize::width(local_30);
  QLatin1Char::QLatin1Char(local_d7,' ');
  QChar::QChar((QChar *)in_stack_fffffffffffffed8,
               (QLatin1Char)(char)((uint)in_stack_fffffffffffffee4 >> 0x18));
  QString::arg((QString *)in_RDI,a,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
               (QChar)(char16_t)((ulong)other >> 0x30));
  fieldWidth = QSize::height(local_30);
  QLatin1Char::QLatin1Char(local_db,' ');
  QChar::QChar((QChar *)in_stack_fffffffffffffed8,
               (QLatin1Char)(char)((uint)in_stack_fffffffffffffee4 >> 0x18));
  QString::arg((QString *)in_RDI,a,fieldWidth,in_stack_fffffffffffffee4,
               (QChar)(char16_t)((ulong)other >> 0x30));
  QString::~QString((QString *)0x1e81f2);
  QString::~QString((QString *)0x1e81ff);
  QString::~QString((QString *)0x1e8209);
  QString::~QString((QString *)0x1e8216);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  local_dc = 0;
  cachedPixmap((QString *)other);
  bVar1 = QPixmap::isNull();
  if ((bVar1 & 1) != 0) {
    QPixmap::QPixmap(local_f8,(QSize *)local_30);
    this = local_f8;
    QPixmap::operator=((QPixmap *)this_00,other);
    QPixmap::~QPixmap(this);
    QPixmap::fill((QColor *)in_RDI);
    cachePixmap(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  }
  local_dc = 1;
  QString::~QString((QString *)0x1e8391);
  return other;
}

Assistant:

QPixmap QtWidgetsExtraCache::cachedPixmapColor(const QColor &color, const QSize &size) {
    const QString key = QString(QStringLiteral("%1-%2x%3-pixmap"))
                            .arg(color.name(QColor::HexArgb))
                            .arg(size.width())
                            .arg(size.height());
    QPixmap pixmap = QtWidgetsExtraCache::cachedPixmap(key);

    if (pixmap.isNull()) {
        pixmap = QPixmap(size);
        pixmap.fill(color);
        QtWidgetsExtraCache::cachePixmap(key, pixmap);
    }

    return pixmap;
}